

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_yield_distribution.cpp
# Opt level: O2

void __thiscall
particle_yield_distribution::collect_particle_yield(particle_yield_distribution *this,int event_id)

{
  double dVar1;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ostream *poVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  
  pvVar2 = (((this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->particle_list->
           super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
           )._M_impl.super__Vector_impl_data._M_start[event_id];
  uVar5 = ((long)*(pointer *)
                  ((long)&pvVar2->super__Vector_base<particle_info,_std::allocator<particle_info>_>
                  + 8) -
          *(long *)&pvVar2->super__Vector_base<particle_info,_std::allocator<particle_info>_>) /
          0x78;
  uVar10 = 0;
  uVar6 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar6 = uVar10;
  }
  iVar8 = 0;
  for (; uVar6 * 0x78 - uVar10 != 0; uVar10 = uVar10 + 0x78) {
    lVar3 = *(long *)&(((this->particle_list).
                        super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       particle_list->
                      super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[event_id]->
                      super__Vector_base<particle_info,_std::allocator<particle_info>_>;
    dVar12 = *(double *)(lVar3 + 0x28 + uVar10);
    dVar11 = *(double *)(lVar3 + 0x30 + uVar10);
    if (this->rap_type == 0) {
      dVar1 = *(double *)(lVar3 + 8 + uVar10);
      dVar11 = dVar11 * dVar11 - dVar1 * dVar1;
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
    }
    dVar12 = log((dVar12 + dVar11) / (dVar11 - dVar12));
    dVar12 = dVar12 * 0.5;
    if ((this->rap_min <= dVar12 && dVar12 != this->rap_min) && (dVar12 < this->rap_max)) {
      lVar3 = *(long *)&(((this->particle_list).
                          super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         particle_list->
                        super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                        )._M_impl.super__Vector_impl_data._M_start[event_id]->
                        super__Vector_base<particle_info,_std::allocator<particle_info>_>;
      dVar12 = *(double *)(lVar3 + 0x18 + uVar10);
      dVar11 = *(double *)(lVar3 + 0x20 + uVar10);
      dVar12 = SQRT(dVar12 * dVar12 + dVar11 * dVar11);
      iVar8 = iVar8 + (uint)(dVar12 < this->pT_max && this->pT_min < dVar12);
    }
  }
  iVar9 = 0;
  if (this->net_particle_flag == 1) {
    pvVar2 = (((this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->anti_particle_list->
             super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
             )._M_impl.super__Vector_impl_data._M_start[event_id];
    uVar5 = ((long)*(pointer *)
                    ((long)&pvVar2->
                            super__Vector_base<particle_info,_std::allocator<particle_info>_> + 8) -
            *(long *)&pvVar2->super__Vector_base<particle_info,_std::allocator<particle_info>_>) /
            0x78;
    uVar10 = 0;
    uVar6 = uVar5 & 0xffffffff;
    if ((int)uVar5 < 1) {
      uVar6 = uVar10;
    }
    iVar9 = 0;
    for (; uVar6 * 0x78 - uVar10 != 0; uVar10 = uVar10 + 0x78) {
      lVar3 = *(long *)&(((this->particle_list).
                          super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         anti_particle_list->
                        super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                        )._M_impl.super__Vector_impl_data._M_start[event_id]->
                        super__Vector_base<particle_info,_std::allocator<particle_info>_>;
      dVar12 = *(double *)(lVar3 + 0x28 + uVar10);
      dVar11 = *(double *)(lVar3 + 0x30 + uVar10);
      if (this->rap_type == 0) {
        dVar1 = *(double *)(lVar3 + 8 + uVar10);
        dVar11 = dVar11 * dVar11 - dVar1 * dVar1;
        if (dVar11 < 0.0) {
          dVar11 = sqrt(dVar11);
        }
        else {
          dVar11 = SQRT(dVar11);
        }
      }
      dVar12 = log((dVar12 + dVar11) / (dVar11 - dVar12));
      dVar12 = dVar12 * 0.5;
      if ((this->rap_min <= dVar12 && dVar12 != this->rap_min) && (dVar12 < this->rap_max)) {
        lVar3 = *(long *)&(((this->particle_list).
                            super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->anti_particle_list->
                          super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                          )._M_impl.super__Vector_impl_data._M_start[event_id]->
                          super__Vector_base<particle_info,_std::allocator<particle_info>_>;
        dVar12 = *(double *)(lVar3 + 0x18 + uVar10);
        dVar11 = *(double *)(lVar3 + 0x20 + uVar10);
        dVar12 = SQRT(dVar12 * dVar12 + dVar11 * dVar11);
        iVar9 = iVar9 + (uint)(dVar12 < this->pT_max && this->pT_min < dVar12);
      }
    }
  }
  uVar4 = this->n_max / 2 + (iVar8 - iVar9);
  if ((-1 < (int)uVar4) && ((int)uVar4 < this->n_max)) {
    this->number_of_events[uVar4] = this->number_of_events[uVar4] + 1;
    return;
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"particle number is out of bound!");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"bound: [");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->n_max / -2);
  poVar7 = std::operator<<(poVar7," , ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->n_max / 2);
  poVar7 = std::operator<<(poVar7,"]");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"count = ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar8);
  poVar7 = std::operator<<(poVar7,", count_anti_particle = ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
  std::endl<char,std::char_traits<char>>(poVar7);
  exit(1);
}

Assistant:

void particle_yield_distribution::collect_particle_yield(int event_id) {
    int number_of_particles = particle_list->get_number_of_particles(event_id);

    int count = 0;
    for (int i = 0; i < number_of_particles; i++) {
        double pz_local = particle_list->get_particle(event_id, i).pz;
        double E_local = particle_list->get_particle(event_id, i).E;

        double rap_local;
        if (rap_type == 0) {
            double mass = particle_list->get_particle(event_id, i).mass;
            double pmag = sqrt(E_local * E_local - mass * mass);
            rap_local = 0.5 * log((pmag + pz_local) / (pmag - pz_local));
        } else {
            rap_local = 0.5 * log((E_local + pz_local) / (E_local - pz_local));
        }

        if (rap_local > rap_min && rap_local < rap_max) {
            double px_local = particle_list->get_particle(event_id, i).px;
            double py_local = particle_list->get_particle(event_id, i).py;
            double p_perp = sqrt(px_local * px_local + py_local * py_local);
            if (p_perp > pT_min && p_perp < pT_max) {
                count++;
            }
        }
    }
    int count_anti_particle = 0;
    if (net_particle_flag == 1) {
        int number_of_anti_particles =
            particle_list->get_number_of_anti_particles(event_id);
        for (int i = 0; i < number_of_anti_particles; i++) {
            double pz_local = particle_list->get_anti_particle(event_id, i).pz;
            double E_local = particle_list->get_anti_particle(event_id, i).E;

            double rap_local;
            if (rap_type == 0) {
                double mass =
                    particle_list->get_anti_particle(event_id, i).mass;
                double pmag = sqrt(E_local * E_local - mass * mass);
                rap_local = 0.5 * log((pmag + pz_local) / (pmag - pz_local));
            } else {
                rap_local =
                    0.5 * log((E_local + pz_local) / (E_local - pz_local));
            }

            if (rap_local > rap_min && rap_local < rap_max) {
                double px_local =
                    particle_list->get_anti_particle(event_id, i).px;
                double py_local =
                    particle_list->get_anti_particle(event_id, i).py;
                double p_perp = sqrt(px_local * px_local + py_local * py_local);
                if (p_perp > pT_min && p_perp < pT_max) {
                    count_anti_particle++;
                }
            }
        }
    }
    int idx = count - count_anti_particle + n_max / 2;
    if (idx < 0 || idx > n_max - 1) {
        cout << "particle number is out of bound!" << endl;
        cout << "bound: [" << -n_max / 2 << " , " << n_max / 2 << "]" << endl;
        cout << "count = " << count
             << ", count_anti_particle = " << count_anti_particle << endl;
        exit(1);
    }
    number_of_events[idx]++;
}